

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O0

void __thiscall logger::OutputWorker::OutputWorker(OutputWorker *this)

{
  long in_RDI;
  condition_variable *this_00;
  OutputWorker *unaff_retaddr;
  __integral_type_conflict1 in_stack_ffffffffffffffac;
  undefined1 __i;
  
  std::mutex::mutex((mutex *)0x1269e8);
  std::mutex::mutex((mutex *)0x1269f6);
  this_00 = (condition_variable *)(in_RDI + 0x50);
  std::condition_variable::condition_variable(this_00);
  std::__cxx11::
  list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>::
  list((list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
        *)0x126a1c);
  std::__cxx11::
  list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>::
  list((list<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
        *)0x126a32);
  std::atomic<int>::atomic((atomic<int> *)this_00,in_stack_ffffffffffffffac);
  __i = (undefined1)((uint)in_stack_ffffffffffffffac >> 0x18);
  std::atomic<bool>::atomic((atomic<bool> *)this_00,(bool)__i);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0xb8));
  std::shared_ptr<std::thread>::shared_ptr((shared_ptr<std::thread> *)0x126a8a);
  std::atomic<bool>::atomic((atomic<bool> *)this_00,(bool)__i);
  Start(unaff_retaddr);
  atexit(AtExitWrapper);
  return;
}

Assistant:

OutputWorker::OutputWorker()
{
    Start();

#if !defined(LOGGER_DISABLE_ATEXIT)
    // Register an atexit() callback so we do not need manual shutdown in app code
    // Application code can still manually shutdown by calling OutputWorker::Stop()
    std::atexit(AtExitWrapper);
#endif // LOGGER_DISABLE_ATEXIT
}